

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O2

void Addr_ESI(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  UInt32 *pUVar1;
  int iVar2;
  Int64 IVar3;
  size_t sVar4;
  ulong MyNumber;
  char (*pacVar5) [8];
  long lVar6;
  
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    pMyOperand->OpMnemonic[2] = '\0';
    pMyOperand->OpMnemonic[0] = '(';
    pMyOperand->OpMnemonic[1] = '%';
    lVar6 = 2;
  }
  else {
    lVar6 = 0;
  }
  pMyOperand->OpType = 0x30000;
  iVar2 = (pMyDisasm->Reserved_).AddressSize;
  if (iVar2 == 0x20) {
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      pacVar5 = Registers32Bits + 0xe;
      goto LAB_00131585;
    }
    pacVar5 = Registers32Bits + 6;
LAB_001315e3:
    strcpy(pMyOperand->OpMnemonic + lVar6,*pacVar5);
    IVar3 = REGS[6];
  }
  else {
    if (iVar2 != 0x40) {
      pUVar1 = &(pMyDisasm->Reserved_).DECALAGE_EIP;
      *pUVar1 = *pUVar1 + 2;
      iVar2 = Security(4,pMyDisasm);
      if (iVar2 == 0) {
        return;
      }
      MyNumber = (ulong)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 2);
      (pMyOperand->Memory).Displacement = MyNumber;
      CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + lVar6,"%.4X",MyNumber);
      goto LAB_001315f6;
    }
    if ((pMyDisasm->Reserved_).REX.B_ != '\x01') {
      pacVar5 = (char (*) [8])(Registers64Bits + 6);
      goto LAB_001315e3;
    }
    pacVar5 = (char (*) [8])(Registers64Bits + 0xe);
LAB_00131585:
    strcpy(pMyOperand->OpMnemonic + lVar6,*pacVar5);
    IVar3 = REGS[0xe];
  }
  (pMyOperand->Memory).BaseRegister = IVar3;
LAB_001315f6:
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    sVar4 = strlen(pMyOperand->OpMnemonic);
    (pMyOperand->OpMnemonic + sVar4)[0] = ')';
    (pMyOperand->OpMnemonic + sVar4)[1] = '\0';
  }
  return;
}

Assistant:

void __bea_callspec__ Addr_ESI(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
    long MyNumber;
    size_t i = 0;
    #ifndef BEA_LIGHT_DISASSEMBLY
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic, "(%");
        i += 2;
    }
     #endif
    pMyOperand->OpType = MEMORY_TYPE;
    if (GV.AddressSize == 64) {
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers64Bits[14]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6+8];
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers64Bits[6]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6];
        }
    }
    else if (GV.AddressSize == 32) {

        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers32Bits[14]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6+8];
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers32Bits[6]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6];
        }
    }
    else {
        GV.DECALAGE_EIP+=2;
        if (!Security(4, pMyDisasm)) return;
        MyNumber = *((UInt16*) (GV.EIP_+2));
        pMyOperand->Memory.Displacement = MyNumber;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+i,"%.4X", (Int64)MyNumber);
        #endif
    }
    #ifndef BEA_LIGHT_DISASSEMBLY
    i = strlen ((char*) &pMyOperand->OpMnemonic);
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
        i += 1;
    }
  #endif
}